

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::PassColorsDown(NeuralNetworkShaper *this,NeuralNetworkLayer *layer)

{
  bool bVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  reference pbVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  reference piVar4;
  int local_84;
  iterator iStack_80;
  int color;
  iterator __end3;
  iterator __begin3;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  set<int,_std::less<int>,_std::allocator<int>_> *outset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outname;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> *inset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inname;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkShaper *this_local;
  
  pRVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(layer);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar2);
  inname = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(pRVar2);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(iterator *)&inname);
    if (!bVar1) break;
    pbVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::operator[](&this->blobColors,pbVar3);
    pRVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(layer);
    __end2 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar2);
    outname = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::end(pRVar2);
    while( true ) {
      bVar1 = google::protobuf::internal::
              RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator!=(&__end2,(iterator *)&outname);
      if (!bVar1) break;
      pbVar3 = google::protobuf::internal::
               RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[](&this->blobColors,pbVar3);
      __end3 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
      iStack_80 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
      while( true ) {
        bVar1 = std::operator!=(&__end3,&stack0xffffffffffffff80);
        if (!bVar1) break;
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&__end3);
        local_84 = *piVar4;
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_01,&local_84);
        std::_Rb_tree_const_iterator<int>::operator++(&__end3);
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::PassColorsDown(const Specification::NeuralNetworkLayer& layer) {
    for (const auto& inname: layer.input()) {
        const std::set<int>& inset = blobColors[inname];
        for (const auto& outname: layer.output()) {
            std::set<int>& outset = blobColors[outname];
            for (int color: inset) {
                outset.insert(color);
            }
        }
    }
}